

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QJsonValue * __thiscall QCborValue::toJsonValue(QCborValue *this)

{
  Type TVar1;
  QCborContainerPrivate *in_RSI;
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffff5f;
  QCborValue *in_stack_ffffffffffffff60;
  QCborValue *this_00;
  uint in_stack_ffffffffffffff68;
  QCborValue *in_stack_ffffffffffffff70;
  Type type;
  QJsonValue *pQVar2;
  ConversionMode in_stack_ffffffffffffff9c;
  qsizetype in_stack_ffffffffffffffa0;
  QCborValue local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  if (in_RSI->usedData != 0) {
    if (*(long *)in_RSI < 0) {
      QCborValue::type((QCborValue *)in_RSI);
      pQVar2 = in_RDI;
    }
    qt_convertToJson(in_RSI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    goto LAB_00489d02;
  }
  TVar1 = QCborValue::type((QCborValue *)in_RSI);
  type = (Type)((ulong)in_RDI >> 0x20);
  if (TVar1 == Invalid) {
LAB_00489bb7:
    QJsonValue::QJsonValue(pQVar2,type);
    goto LAB_00489d02;
  }
  if (TVar1 == Integer) {
    QJsonPrivate::Value::fromTrustedCbor((QCborValue *)(ulong)in_stack_ffffffffffffff68);
    goto LAB_00489d02;
  }
  if ((TVar1 == ByteArray) || (TVar1 == String)) {
    QJsonValue::QJsonValue(pQVar2,type);
    goto LAB_00489d02;
  }
  if (TVar1 == Array) {
    QJsonArray::QJsonArray((QJsonArray *)0x489c07);
    QJsonValue::QJsonValue
              ((QJsonValue *)in_stack_ffffffffffffff70,
               (QJsonArray *)CONCAT44(TVar1,in_stack_ffffffffffffff68));
    QJsonArray::~QJsonArray((QJsonArray *)0x489c26);
    goto LAB_00489d02;
  }
  if (TVar1 == Map) {
    QJsonObject::QJsonObject((QJsonObject *)0x489c35);
    QJsonValue::QJsonValue
              ((QJsonValue *)in_stack_ffffffffffffff70,
               (QJsonObject *)CONCAT44(TVar1,in_stack_ffffffffffffff68));
    QJsonObject::~QJsonObject((QJsonObject *)0x489c4e);
    goto LAB_00489d02;
  }
  if (TVar1 == Tag) {
LAB_00489c53:
    QJsonValue::QJsonValue(pQVar2,type);
  }
  else {
    if (TVar1 != SimpleType) {
      if (TVar1 == False) {
        QJsonValue::QJsonValue
                  ((QJsonValue *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
        goto LAB_00489d02;
      }
      if (TVar1 == True) {
        QJsonValue::QJsonValue
                  ((QJsonValue *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
        goto LAB_00489d02;
      }
      if ((uint)(TVar1 + ~True) < 2) goto LAB_00489bb7;
      if (TVar1 == Double) {
        fp_helper(in_stack_ffffffffffffff60);
        fpToJson((double)CONCAT44(TVar1,in_stack_ffffffffffffff68));
        goto LAB_00489d02;
      }
      if ((((TVar1 == DateTime) || (TVar1 == Url)) || (TVar1 == RegularExpression)) ||
         (TVar1 == Uuid)) goto LAB_00489c53;
    }
    QCborValue::type((QCborValue *)in_RSI);
    this_00 = local_48;
    simpleTypeString((Type)((ulong)in_RSI >> 0x20));
    QCborValue(in_stack_ffffffffffffff70,(QString *)CONCAT44(TVar1,in_stack_ffffffffffffff68));
    QJsonPrivate::Value::fromTrustedCbor((QCborValue *)CONCAT44(TVar1,in_stack_ffffffffffffff68));
    ~QCborValue(this_00);
    QString::~QString((QString *)0x489cc1);
  }
LAB_00489d02:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QJsonValue QCborValue::toJsonValue() const
{
    if (container)
        return qt_convertToJson(container, n < 0 ? -type() : n);

    // simple values
    switch (type()) {
    case False:
        return false;

    case Integer:
        return QJsonPrivate::Value::fromTrustedCbor(*this);

    case True:
        return true;

    case Null:
    case Undefined:
    case Invalid:
        return QJsonValue();

    case Double:
        return fpToJson(fp_helper());

    case SimpleType:
        break;

    case ByteArray:
    case String:
        // empty strings
        return QJsonValue::String;

    case Array:
        // empty array
        return QJsonArray();

    case Map:
        // empty map
        return QJsonObject();

    case Tag:
    case DateTime:
    case Url:
    case RegularExpression:
    case Uuid:
        // Reachable, but invalid in Json
        return QJsonValue::Undefined;
    }

    return QJsonPrivate::Value::fromTrustedCbor(simpleTypeString(type()));
}